

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  sqlite3 *db_00;
  int iVar1;
  Table *pTVar2;
  Table *pTVar3;
  Column *pCVar4;
  char *pcVar5;
  Vdbe *pVVar6;
  Column *pCol;
  sqlite3 *db;
  int local_38;
  int nAlloc;
  int i;
  int iDb;
  Vdbe *v;
  Table *pTab;
  Table *pNew;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') &&
     (pTVar2 = sqlite3LocateTableItem(pParse,0,pSrc->a), pTVar2 != (Table *)0x0)) {
    if ((pTVar2->tabFlags & 0x10) == 0) {
      if (pTVar2->pSelect == (Select *)0x0) {
        iVar1 = isSystemTable(pParse,pTVar2->zName);
        if (iVar1 == 0) {
          iVar1 = sqlite3SchemaToIndex(db_00,pTVar2->pSchema);
          pTVar3 = (Table *)sqlite3DbMallocZero(db_00,0x80);
          if (pTVar3 != (Table *)0x0) {
            pParse->pNewTable = pTVar3;
            pTVar3->nTabRef = 1;
            pTVar3->nCol = pTVar2->nCol;
            pCVar4 = (Column *)
                     sqlite3DbMallocZero(db_00,(long)(((pTVar3->nCol + -1) / 8) * 8 + 8) << 5);
            pTVar3->aCol = pCVar4;
            pcVar5 = sqlite3MPrintf(db_00,"sqlite_altertab_%s",pTVar2->zName);
            pTVar3->zName = pcVar5;
            if ((pTVar3->aCol != (Column *)0x0) && (pTVar3->zName != (char *)0x0)) {
              memcpy(pTVar3->aCol,pTVar2->aCol,(long)pTVar3->nCol << 5);
              for (local_38 = 0; local_38 < pTVar3->nCol; local_38 = local_38 + 1) {
                pCVar4 = pTVar3->aCol + local_38;
                pcVar5 = sqlite3DbStrDup(db_00,pCVar4->zName);
                pCVar4->zName = pcVar5;
                pCVar4->zColl = (char *)0x0;
                pCVar4->pDflt = (Expr *)0x0;
              }
              pTVar3->pSchema = db_00->aDb[iVar1].pSchema;
              pTVar3->addColOffset = pTVar2->addColOffset;
              pTVar3->nTabRef = 1;
              sqlite3BeginWriteOperation(pParse,0,iVar1);
              pVVar6 = sqlite3GetVdbe(pParse);
              if (pVVar6 != (Vdbe *)0x0) {
                sqlite3ChangeCookie(pParse,iVar1);
              }
            }
          }
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"Cannot add a column to a view");
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"virtual tables may not be altered");
    }
  }
  sqlite3SrcListDelete(db_00,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  Vdbe *v;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isSystemTable(pParse, pTab->zName) ){
    goto exit_begin_add_column;
  }

  assert( pTab->addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zName = sqlite3DbStrDup(db, pCol->zName);
    pCol->zColl = 0;
    pCol->pDflt = 0;
  }
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->addColOffset = pTab->addColOffset;
  pNew->nTabRef = 1;

  /* Begin a transaction and increment the schema cookie.  */
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  v = sqlite3GetVdbe(pParse);
  if( !v ) goto exit_begin_add_column;
  sqlite3ChangeCookie(pParse, iDb);

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}